

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clarnd.c
# Opt level: O1

void clarnd_slu(singlecomplex *ret_val,int *idist,int *iseed)

{
  double dVar1;
  float fVar2;
  singlecomplex q__1;
  singlecomplex q__2;
  singlecomplex q__3;
  singlecomplex local_38;
  double local_30;
  singlecomplex local_28;
  singlecomplex local_20;
  
  dVar1 = dlaran_sluslu(iseed);
  clarnd_slu::t1 = (float)dVar1;
  dVar1 = dlaran_sluslu(iseed);
  clarnd_slu::t2 = (float)dVar1;
  switch(*idist) {
  case 1:
    fVar2 = clarnd_slu::t1;
    local_38.i = clarnd_slu::t2;
    break;
  case 2:
    fVar2 = clarnd_slu::t1 + clarnd_slu::t1 + -1.0;
    local_38.i = clarnd_slu::t2 + clarnd_slu::t2 + -1.0;
    break;
  case 3:
    local_30 = log((double)clarnd_slu::t1);
    local_30 = local_30 * -2.0;
    goto LAB_0010bb85;
  case 4:
    local_30 = (double)clarnd_slu::t1;
LAB_0010bb85:
    if (local_30 < 0.0) {
      local_30 = sqrt(local_30);
    }
    else {
      local_30 = SQRT(local_30);
    }
    local_20.i = clarnd_slu::t2 * 6.2831855;
    local_20.r = 0.0;
    c_exp(&local_28,&local_20);
    ret_val->r = (float)((double)local_28.r * local_30);
    ret_val->i = (float)((double)local_28.i * local_30);
    return;
  case 5:
    local_28.i = clarnd_slu::t2 * 6.2831855;
    local_28.r = 0.0;
    c_exp(&local_38,&local_28);
    ret_val->r = local_38.r;
    goto LAB_0010bc39;
  default:
    local_38.r = 0.0;
    input_error("clarnd",(int *)&local_38);
    return;
  }
  ret_val->r = fVar2;
LAB_0010bc39:
  ret_val->i = local_38.i;
  return;
}

Assistant:

void clarnd_slu(singlecomplex * ret_val, int *idist, int *iseed)
{
    /* System generated locals */
    double d__1, d__2;
    singlecomplex q__1, q__2, q__3;

    /* Local variables */
    static float t1, t2;
    extern double dlaran_sluslu(int *);
    extern int input_error(char *, int *);


/*  -- LAPACK auxiliary routine (version 2.0) --   
       Univ. of Tennessee, Univ. of California Berkeley, NAG Ltd.,   
       Courant Institute, Argonne National Lab, and Rice University   
       September 30, 1994   


    Purpose   
    =======   

    CLARND returns a random complex number from a uniform or normal   
    distribution.   

    Arguments   
    =========   

    IDIST   (input) INTEGER   
            Specifies the distribution of the random numbers:   
            = 1:  real and imaginary parts each uniform (0,1)   
            = 2:  real and imaginary parts each uniform (-1,1)   
            = 3:  real and imaginary parts each normal (0,1)   
            = 4:  uniformly distributed on the disc abs(z) <= 1   
            = 5:  uniformly distributed on the circle abs(z) = 1   

    ISEED   (input/output) INTEGER array, dimension (4)   
            On entry, the seed of the random number generator; the array 
  
            elements must be between 0 and 4095, and ISEED(4) must be   
            odd.   
            On exit, the seed is updated.   

    Further Details   
    ===============   

    This routine calls the auxiliary routine SLARAN to generate a random 
  
    real number from a uniform (0,1) distribution. The Box-Muller method 
  
    is used to transform numbers from a uniform to a normal distribution. 
  

    ===================================================================== 
  


       Generate a pair of real random numbers from a uniform (0,1)   
       distribution   

       Parameter adjustments */
    --iseed;

    /* Function Body */
    t1 = dlaran_sluslu(&iseed[1]);
    t2 = dlaran_sluslu(&iseed[1]);

/*        real and imaginary parts each uniform (0,1) */
    if (*idist == 1) {
	q__1.r = t1, q__1.i = t2;
	 ret_val->r = q__1.r,  ret_val->i = q__1.i;

/*        real and imaginary parts each uniform (-1,1) */
    } else if (*idist == 2) {
	d__1 = t1 * 2.f - 1.f;
	d__2 = t2 * 2.f - 1.f;
	q__1.r = d__1, q__1.i = d__2;
	 ret_val->r = q__1.r,  ret_val->i = q__1.i;

/*        real and imaginary parts each normal (0,1) */
    } else if (*idist == 3) {
	d__1 = sqrt(log(t1) * -2.f);
	d__2 = t2 * 6.2831853071795864769252867663f;
	q__3.r = 0.f, q__3.i = d__2;
	c_exp(&q__2, &q__3);
	q__1.r = d__1 * q__2.r, q__1.i = d__1 * q__2.i;
	 ret_val->r = q__1.r,  ret_val->i = q__1.i;

/*        uniform distribution on the unit disc abs(z) <= 1 */
    } else if (*idist == 4) {
	d__1 = sqrt(t1);
	d__2 = t2 * 6.2831853071795864769252867663f;
	q__3.r = 0.f, q__3.i = d__2;
	c_exp(&q__2, &q__3);
	q__1.r = d__1 * q__2.r, q__1.i = d__1 * q__2.i;
	 ret_val->r = q__1.r,  ret_val->i = q__1.i;

/*        uniform distribution on the unit circle abs(z) = 1 */
    } else if (*idist == 5) {
	d__1 = t2 * 6.2831853071795864769252867663f;
	q__2.r = 0.f, q__2.i = d__1;
	c_exp(&q__1, &q__2);
	 ret_val->r = q__1.r,  ret_val->i = q__1.i;
    }

/*        invalid input, *idist must be 1, 2, 3, 4, or 5  */
    else {
        int argument = 0;
        input_error("clarnd", &argument);
        ret_val = 0;
    }

/*     End of CLARND */

}